

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O1

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkPointFrame::GetConstraintViolation(ChLinkPointFrame *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  void *pvVar8;
  undefined8 *puVar9;
  _func_int **pp_Var10;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar11;
  ActualDstType actualDst;
  long in_RSI;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChVectorDynamic<> CVar37;
  ChQuaternion<double> q;
  ChMatrix33<double> Arw;
  ChQuaternion<double> local_98;
  ChMatrix33<double> local_70;
  
  lVar4 = *(long *)(in_RSI + 0x268);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(lVar4 + 0x20);
  dVar1 = *(double *)(lVar4 + 0x28);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  dVar2 = *(double *)(in_RSI + 0x290);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(double *)(in_RSI + 0x298);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(double *)(in_RSI + 0x298) * dVar1;
  auVar18 = vfmsub231sd_fma(auVar24,auVar12,auVar18);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(double *)(lVar4 + 0x30);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(in_RSI + 0x2a0);
  auVar18 = vfnmadd231sd_fma(auVar18,auVar26,auVar28);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(double *)(lVar4 + 0x38);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(in_RSI + 0x2a8);
  auVar24 = vfnmadd231sd_fma(auVar18,auVar30,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar2 * dVar1;
  auVar18 = vfmadd231sd_fma(auVar33,auVar12,auVar21);
  auVar18 = vfnmadd231sd_fma(auVar18,auVar30,auVar28);
  auVar18 = vfmadd231sd_fma(auVar18,auVar26,auVar32);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2 * *(double *)(lVar4 + 0x30);
  auVar19 = vfmadd231sd_fma(auVar35,auVar12,auVar28);
  auVar19 = vfmadd231sd_fma(auVar19,auVar30,auVar21);
  auVar30 = vfnmadd231sd_fma(auVar19,auVar15,auVar32);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2 * *(double *)(lVar4 + 0x38);
  auVar19 = vfmadd231sd_fma(auVar19,auVar12,auVar32);
  auVar19 = vfnmadd231sd_fma(auVar19,auVar26,auVar21);
  auVar19 = vfmadd231sd_fma(auVar19,auVar15,auVar28);
  local_98.m_data[0] = auVar24._0_8_;
  local_98.m_data[1] = auVar18._0_8_;
  local_98.m_data[2] = auVar30._0_8_;
  local_98.m_data[3] = auVar19._0_8_;
  ChMatrix33<double>::ChMatrix33(&local_70,&local_98);
  lVar4 = *(long *)(in_RSI + 600);
  ChTransform<double>::TransformLocalToParent
            ((ChVector<double> *)(in_RSI + 0x278),
             (ChVector<double> *)(*(long *)(in_RSI + 0x268) + 8),
             (ChMatrix33<double> *)(*(long *)(in_RSI + 0x268) + 0x40));
  dVar7 = local_98.m_data[2];
  dVar6 = local_98.m_data[1];
  dVar5 = local_98.m_data[0];
  dVar1 = *(double *)(lVar4 + 0x20);
  dVar2 = *(double *)(lVar4 + 0x28);
  dVar3 = *(double *)(lVar4 + 0x30);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj = (_func_int **)0x0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x0;
  IVar11 = extraout_RDX;
  if ((this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p !=
      (pointer)0x3) {
    pp_Var10 = (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj;
    if (pp_Var10 != (_func_int **)0x0) {
      free(pp_Var10[-1]);
    }
    pvVar8 = malloc(0x58);
    if (pvVar8 == (void *)0x0) {
      pp_Var10 = (_func_int **)0x0;
    }
    else {
      *(void **)(((ulong)pvVar8 & 0xffffffffffffffc0) + 0x38) = pvVar8;
      pp_Var10 = (_func_int **)(((ulong)pvVar8 & 0xffffffffffffffc0) + 0x40);
    }
    if (pp_Var10 == (_func_int **)0x0) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj = pp_Var10;
    IVar11 = extraout_RDX_00;
  }
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar3 = dVar3 - dVar7;
  dVar1 = dVar1 - dVar5;
  dVar2 = dVar2 - dVar6;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar2;
  auVar18 = vfmadd213sd_fma(auVar36,auVar16,auVar22);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3;
  auVar18 = vfmadd213sd_fma(auVar31,auVar13,auVar18);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       dVar2;
  auVar19 = vfmadd213sd_fma(auVar34,auVar16,auVar23);
  auVar19 = vfmadd213sd_fma(auVar29,auVar13,auVar19);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_70.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       dVar2;
  auVar24 = vfmadd213sd_fma(auVar25,auVar17,auVar20);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar3;
  auVar24 = vfmadd213sd_fma(auVar27,auVar14,auVar24);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x3;
  pp_Var10 = (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj;
  *pp_Var10 = auVar24._0_8_;
  pp_Var10[1] = auVar19._0_8_;
  pp_Var10[2] = auVar18._0_8_;
  CVar37.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar11;
  CVar37.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ChVectorDynamic<>)
         CVar37.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

ChVectorDynamic<> ChLinkPointFrame::GetConstraintViolation() const {
    ChMatrix33<> Arw(m_csys.rot >> m_body->GetRot());
    ChVector<> res = Arw.transpose() * (m_node->GetPos() - m_body->TransformPointLocalToParent(m_csys.pos));
    ChVectorN<double, 3> C;
    C(0) = res.x();
    C(1) = res.y();
    C(2) = res.z();
    return C;
}